

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O2

void __thiscall ApplicationContext::~ApplicationContext(ApplicationContext *this)

{
  CSP *this_00;
  Blackboard *pBVar1;
  
  (this->super_ApplicationContextBase)._vptr_ApplicationContextBase =
       (_func_int **)&PTR__ApplicationContext_001db620;
  (this->super_ApplicationContextBase).join_now = true;
  std::thread::join();
  this_00 = this->csp;
  if (this_00 != (CSP *)0x0) {
    CSP::~CSP(this_00);
  }
  operator_delete(this_00,0x2f0);
  pBVar1 = this->blackboard;
  if (pBVar1 != (Blackboard *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_TypedData_*>,_std::_Select1st<std::pair<const_int,_TypedData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TypedData_*>_>_>
    ::~_Rb_tree(&(pBVar1->values)._M_t);
  }
  operator_delete(pBVar1,0x60);
  std::vector<JournalEntry,_std::allocator<JournalEntry>_>::~vector(&this->journal);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->lines);
  std::thread::~thread(&this->clock);
  ApplicationContextBase::~ApplicationContextBase(&this->super_ApplicationContextBase);
  return;
}

Assistant:

~ApplicationContext()
    {
        ///>
        /// join_now is most likely true from having been set by a Quit
        /// event, but just to be sure, set it here.
        ///<C++
        join_now = true;

        ///>
        /// Allow the clock thread to join gracefully
        ///<C++
        clock.join();

        delete csp;
        delete blackboard;
    }